

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdcDec.c
# Opt level: O0

void Bdc_SuppMinimize(Bdc_Man_t *p,Bdc_Isf_t *pIsf)

{
  int iVar1;
  abctime aVar2;
  long local_28;
  abctime clk;
  int v;
  Bdc_Isf_t *pIsf_local;
  Bdc_Man_t *p_local;
  
  local_28 = 0;
  if (p->pPars->fVerbose != 0) {
    local_28 = Abc_Clock();
  }
  pIsf->uSupp = 0;
  for (clk._4_4_ = 0; clk._4_4_ < p->nVars; clk._4_4_ = clk._4_4_ + 1) {
    iVar1 = Kit_TruthVarInSupport(pIsf->puOn,p->nVars,clk._4_4_);
    if ((iVar1 != 0) || (iVar1 = Kit_TruthVarInSupport(pIsf->puOff,p->nVars,clk._4_4_), iVar1 != 0))
    {
      iVar1 = Kit_TruthVarIsVacuous(pIsf->puOn,pIsf->puOff,p->nVars,clk._4_4_);
      if (iVar1 == 0) {
        pIsf->uSupp = 1 << ((byte)clk._4_4_ & 0x1f) | pIsf->uSupp;
      }
      else {
        Kit_TruthExist(pIsf->puOn,p->nVars,clk._4_4_);
        Kit_TruthExist(pIsf->puOff,p->nVars,clk._4_4_);
      }
    }
  }
  if (p->pPars->fVerbose != 0) {
    aVar2 = Abc_Clock();
    p->timeSupps = (aVar2 - local_28) + p->timeSupps;
  }
  return;
}

Assistant:

void Bdc_SuppMinimize( Bdc_Man_t * p, Bdc_Isf_t * pIsf )
{
    int v;
    abctime clk = 0; // Suppress "might be used uninitialized"
    if ( p->pPars->fVerbose )
        clk = Abc_Clock();
    // go through the support variables
    pIsf->uSupp = 0;
    for ( v = 0; v < p->nVars; v++ )
    {
        if ( !Kit_TruthVarInSupport( pIsf->puOn, p->nVars, v ) && 
             !Kit_TruthVarInSupport( pIsf->puOff, p->nVars, v ) )
              continue;
        if ( Kit_TruthVarIsVacuous( pIsf->puOn, pIsf->puOff, p->nVars, v ) )
        {
            Kit_TruthExist( pIsf->puOn, p->nVars, v );
            Kit_TruthExist( pIsf->puOff, p->nVars, v );
            continue;
        }
        pIsf->uSupp |= (1 << v);
    }
    if ( p->pPars->fVerbose )
        p->timeSupps += Abc_Clock() - clk;
}